

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_context.c
# Opt level: O3

int SUNContext_GetProfiler(SUNContext sunctx,SUNProfiler *profiler)

{
  if (sunctx != (SUNContext)0x0) {
    *profiler = (SUNProfiler)0x0;
    return 0;
  }
  return -1;
}

Assistant:

int SUNContext_GetProfiler(SUNContext sunctx, SUNProfiler* profiler)
{
  if (sunctx == NULL)
  {
    return (-1);
  }

#ifdef SUNDIALS_BUILD_WITH_PROFILING
  /* get profiler */
  *profiler = sunctx->profiler;
#else
  *profiler = NULL;
#endif

  return (0);
}